

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O2

void http_parse_cookies_cookie_str(FIOBJ dest,FIOBJ str,uint8_t is_url_encoded)

{
  size_t sVar1;
  char *name;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  fio_str_info_s s;
  fio_str_info_s fStack_48;
  
  if (((uint)str & 7) == 2) {
    fiobj_obj2cstr(&fStack_48,str);
    while (name = fStack_48.data, sVar1 = fStack_48.len, fStack_48.len != 0) {
      if (*fStack_48.data == ' ') {
        fStack_48.len = fStack_48.len - 1;
        fStack_48.data = fStack_48.data + 1;
      }
      else {
        __s = (char *)memchr(fStack_48.data,0x3d,fStack_48.len);
        if (__s == (char *)0x0) {
          __s = name;
        }
        pcVar2 = (char *)memchr(__s,0x3b,(long)(name + sVar1) - (long)__s);
        pcVar3 = name + sVar1;
        if (pcVar2 != (char *)0x0) {
          pcVar3 = pcVar2;
        }
        http_add2hash(dest,name,(long)__s - (long)name,__s + 1,(long)pcVar3 - (long)(__s + 1),
                      is_url_encoded);
        pcVar3 = pcVar3 + 1;
        bVar4 = fStack_48.len < (ulong)((long)pcVar3 - (long)fStack_48.data);
        fStack_48.len = fStack_48.len - ((long)pcVar3 - (long)fStack_48.data);
        fStack_48.data = pcVar3;
        if (bVar4) {
          fStack_48.len = 0;
        }
      }
    }
  }
  return;
}

Assistant:

FIO_INLINE size_t fiobj_type_is(FIOBJ o, fiobj_type_enum type) {
  switch (type) {
  case FIOBJ_T_NUMBER:
    return (o & FIOBJECT_NUMBER_FLAG) ||
           ((fiobj_type_enum *)o)[0] == FIOBJ_T_NUMBER;
  case FIOBJ_T_NULL:
    return !o || o == fiobj_null();
  case FIOBJ_T_TRUE:
    return o == fiobj_true();
  case FIOBJ_T_FALSE:
    return o == fiobj_false();
  case FIOBJ_T_STRING:
    return (FIOBJECT_STRING_FLAG && (o & FIOBJECT_NUMBER_FLAG) == 0 &&
            (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_STRING_FLAG) ||
           (FIOBJECT_STRING_FLAG == 0 && FIOBJ_IS_ALLOCATED(o) &&
            ((fiobj_type_enum *)FIOBJ2PTR(o))[0] == FIOBJ_T_STRING);
  case FIOBJ_T_HASH:
    if (FIOBJECT_HASH_FLAG) {
      return ((o & FIOBJECT_NUMBER_FLAG) == 0 &&
              (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_HASH_FLAG);
    }
  /* fallthrough */
  case FIOBJ_T_FLOAT:
  case FIOBJ_T_ARRAY:
  case FIOBJ_T_DATA:
  case FIOBJ_T_UNKNOWN:
    return FIOBJ_IS_ALLOCATED(o) &&
           ((fiobj_type_enum *)FIOBJ2PTR(o))[0] == type;
  }
  return FIOBJ_IS_ALLOCATED(o) && ((fiobj_type_enum *)FIOBJ2PTR(o))[0] == type;
}